

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z_libpd.c
# Opt level: O2

int libpd_sysex(int port,int byte)

{
  if (0xff < (uint)byte || 0xfff < (uint)port) {
    return -1;
  }
  sys_lock();
  inmidi_sysex(port,byte);
  sys_unlock();
  return 0;
}

Assistant:

int libpd_sysex(int port, int byte) {
  CHECK_PORT
  CHECK_RANGE_8BIT(byte)
  sys_lock();
  inmidi_sysex(port, byte);
  sys_unlock();
  return 0;
}